

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::AltNode::AnnotatePass1
          (AltNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  bool bVar1;
  ThreadContext *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  CharSet<char16_t> *this_01;
  AltNode *local_70;
  AltNode *curr;
  CountDomain CStack_60;
  int item;
  CountDomain prevConsumes;
  TrackAllocData local_48;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  Compiler *pCStack_18;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  AltNode *this_local;
  
  local_1c = parentNotNegated;
  local_1b = parentNotSpeculative;
  local_1a = parentAtLeastOnce;
  local_19 = parentNotInLoop;
  pCStack_18 = compiler;
  compiler_local = (Compiler *)this;
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,pCStack_18->scriptContext,(PVOID)0x0);
  (this->super_Node).features = 0x80;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (local_19 & 1) << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (local_1a & 1) << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (local_1b & 1) << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (local_1c & 1) << 0xd;
  pAVar2 = &pCStack_18->ctAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&CharSet<char16_t>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
             ,0x88e);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar2,&local_48);
  prevConsumes = (CountDomain)Memory::ArenaAllocator::Alloc;
  this_01 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar2,0x3f67b0)
  ;
  CharSet<char16_t>::CharSet(this_01);
  (this->super_Node).firstSet = this_01;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffef | 0x10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffdf | 0x20;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe | 1;
  CountDomain::CountDomain(&stack0xffffffffffffffa0);
  curr._4_4_ = 0;
  for (local_70 = this; local_70 != (AltNode *)0x0; local_70 = local_70->tail) {
    (*local_70->head->_vptr_Node[7])
              (local_70->head,pCStack_18,(ulong)(local_19 & 1),0,(ulong)(local_1b & 1),
               (ulong)(*(uint *)&(this->super_Node).field_0xc >> 0xd & 1));
    (this->super_Node).features = (this->super_Node).features | local_70->head->features;
    if ((*(uint *)&local_70->head->field_0xc >> 4 & 1) == 0) {
      *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xffffffef;
    }
    if ((*(uint *)&local_70->head->field_0xc >> 5 & 1) == 0) {
      *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xffffffdf;
    }
    if (curr._4_4_ == 0) {
      (this->super_Node).thisConsumes = local_70->head->thisConsumes;
      CStack_60 = (this->super_Node).thisConsumes;
    }
    else {
      CountDomain::Lub(&(this->super_Node).thisConsumes,&local_70->head->thisConsumes);
      bVar1 = CountDomain::IsLessThan(&local_70->head->thisConsumes,&stack0xffffffffffffffa0);
      if (!bVar1) {
        *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xffffffef
        ;
      }
      bVar1 = CountDomain::IsGreaterThan(&local_70->head->thisConsumes,&stack0xffffffffffffffa0);
      if (!bVar1) {
        *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xffffffdf
        ;
      }
      CStack_60 = local_70->head->thisConsumes;
    }
    CharSet<char16_t>::UnionInPlace
              ((this->super_Node).firstSet,pCStack_18->ctAllocator,local_70->head->firstSet);
    if (((*(uint *)&local_70->head->field_0xc & 1) == 0) ||
       ((*(uint *)&local_70->head->field_0xc >> 1 & 1) != 0)) {
      *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe;
    }
    if ((*(uint *)&local_70->head->field_0xc >> 1 & 1) != 0) {
      *(uint *)&(this->super_Node).field_0xc =
           *(uint *)&(this->super_Node).field_0xc & 0xfffffffd | 2;
    }
    curr._4_4_ = curr._4_4_ + 1;
  }
  return;
}

Assistant:

void AltNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        features = HasAlt;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;

        // Overall alternative:
        //  - is irrefutable if at least one item is irrefutable
        //  - will not progress(regress) if each item will not progress(regress) and has strictly decreasing(increasing) consumes

        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isFirstExact = true;
        CountDomain prevConsumes;
        int item = 0;
        for (AltNode *curr = this; curr != 0; curr = curr->tail, item++)
        {
            curr->head->AnnotatePass1(compiler, parentNotInLoop, false, parentNotSpeculative, isNotNegated);
            features |= curr->head->features;
            if (!curr->head->isThisWillNotProgress)
                isThisWillNotProgress = false;
            if (!curr->head->isThisWillNotRegress)
                isThisWillNotRegress = false;
            if (item == 0)
                prevConsumes = thisConsumes = curr->head->thisConsumes;
            else
            {
                thisConsumes.Lub(curr->head->thisConsumes);
                if (!curr->head->thisConsumes.IsLessThan(prevConsumes))
                    isThisWillNotProgress = false;
                if (!curr->head->thisConsumes.IsGreaterThan(prevConsumes))
                    isThisWillNotRegress = false;
                prevConsumes = curr->head->thisConsumes;
            }
            firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
            if (!curr->head->isFirstExact || curr->head->isThisIrrefutable)
                // If any item is irrefutable then later items may never be taken, so first set cannot be exact
                isFirstExact = false;
            if (curr->head->isThisIrrefutable)
                isThisIrrefutable = true;
        }
    }